

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGetterCalls.cpp
# Opt level: O1

void __thiscall
glcts::TextureCubeMapArrayGetterCalls::verifyGetTexParameter
          (TextureCubeMapArrayGetterCalls *this,GLenum pname,GLint expected_value)

{
  ostringstream *poVar1;
  int iVar2;
  undefined4 extraout_var;
  char *__s;
  size_t sVar3;
  MessageBuilder *this_00;
  TestError *this_01;
  GLint int_value;
  char *local_1a8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar2) + 0xad0))(0x9009,pname);
  iVar2 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  if (iVar2 == 0) {
    if (expected_value != 0) {
      local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"glGetTexParameteriv() called for pname: [",0x29);
      __s = getStringForGetTexParameterPname(pname);
      sVar3 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,__s,sVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"] returned an invalid value of:[",0x20);
      std::ostream::operator<<(poVar1,0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"], expected:[",0xd);
      std::ostream::operator<<(poVar1,expected_value);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"]",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_128);
      this->m_test_passed = '\0';
    }
    return;
  }
  local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"glGetTexParameteriv() call failed for pname: ",0x2d);
  local_1a8 = getStringForGetTexParameterPname(pname);
  this_00 = tcu::MessageBuilder::operator<<((MessageBuilder *)local_1a0,&local_1a8);
  tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"glGetTexLevelParameteriv() call failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_cube_map_array/esextcTextureCubeMapArrayGetterCalls.cpp"
             ,0x1e4);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureCubeMapArrayGetterCalls::verifyGetTexParameter(glw::GLenum pname, glw::GLint expected_value)
{
	/* Retrieve ES function pointers */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint int_value = 0;

	/* Retrieve property value(s) using glGetTexParameteriv() */
	gl.getTexParameteriv(GL_TEXTURE_CUBE_MAP_ARRAY, pname, &int_value);

	if (gl.getError() != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetTexParameteriv() call failed for pname: " << getStringForGetTexParameterPname(pname)
						   << tcu::TestLog::EndMessage;

		TCU_FAIL("glGetTexLevelParameteriv() call failed");
	}

	if (int_value != expected_value)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetTexParameteriv() called for pname: "
													   "["
						   << getStringForGetTexParameterPname(pname) << "]"
																		 " returned an invalid value of:"
																		 "["
						   << int_value << "]"
										   ", expected:"
										   "["
						   << expected_value << "]" << tcu::TestLog::EndMessage;

		m_test_passed = false;
	}
}